

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,uint *arg_1,
          uint *arg_2,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_3)

{
  string_view data;
  string_view format_00;
  Arg *in_stack_fffffffffffffee0;
  string local_110;
  Arg local_f0;
  Arg local_c0;
  Arg local_90;
  size_type local_60;
  pointer local_58;
  
  format_00._M_len = format._M_str;
  local_58 = (arg->_M_dataplus)._M_p;
  local_60 = arg->_M_string_length;
  absl::lts_20240722::substitute_internal::Arg::Arg(&local_90,*arg_1);
  absl::lts_20240722::substitute_internal::Arg::Arg(&local_c0,*arg_2);
  local_f0.piece_._M_str = (arg_3->_M_dataplus)._M_p;
  local_f0.piece_._M_len = arg_3->_M_string_length;
  format_00._M_str = (char *)&local_60;
  absl::lts_20240722::Substitute_abi_cxx11_
            (&local_110,(lts_20240722 *)format._M_len,format_00,&local_90,&local_c0,&local_f0,
             in_stack_fffffffffffffee0);
  data._M_str = local_110._M_dataplus._M_p;
  data._M_len = local_110._M_string_length;
  Write(this,data);
  std::__cxx11::string::~string((string *)&local_110);
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }